

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<float>_>::MultAdd
          (TPZMatrix<Fad<float>_> *this,TPZFMatrix<Fad<float>_> *x,TPZFMatrix<Fad<float>_> *y,
          TPZFMatrix<Fad<float>_> *z,Fad<float> *alpha,Fad<float> *beta,int opt)

{
  int64_t iVar1;
  int64_t iVar2;
  Fad<float> *this_00;
  Fad<float> *pFVar3;
  Fad<float> *in_RCX;
  TPZFMatrix<Fad<float>_> *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  char *in_R8;
  int in_stack_00000008;
  Fad<float> val;
  int64_t r;
  int64_t c;
  int64_t ic;
  int64_t xcols;
  int64_t cols;
  int64_t rows;
  Fad<float> *in_stack_fffffffffffffde0;
  Fad<float> *this_01;
  Fad<float> *in_stack_fffffffffffffde8;
  Fad<float> *in_stack_fffffffffffffdf0;
  Fad<float> *in_stack_fffffffffffffdf8;
  Fad<float> *in_stack_fffffffffffffe18;
  undefined1 local_1a0 [20];
  int in_stack_fffffffffffffe74;
  Fad<float> *in_stack_fffffffffffffe78;
  TPZFMatrix<Fad<float>_> *in_stack_fffffffffffffe80;
  TPZFMatrix<Fad<float>_> *in_stack_fffffffffffffe88;
  TPZMatrix<Fad<float>_> *in_stack_fffffffffffffe90;
  undefined1 local_160 [48];
  undefined8 local_130;
  undefined1 local_128 [32];
  undefined1 local_108 [80];
  undefined8 local_b8;
  undefined1 local_b0 [48];
  Fad<float> local_80;
  Fad<float> *local_60;
  long local_58;
  Fad<float> *local_50;
  int64_t local_48;
  int64_t local_40;
  int64_t local_38;
  Fad<float> *pFVar4;
  
  if (in_stack_00000008 == 0) {
    iVar1 = TPZBaseMatrix::Cols(in_RDI);
    iVar2 = TPZBaseMatrix::Rows(in_RSI);
    if (iVar1 == iVar2) goto LAB_0131d1e8;
LAB_0131d211:
    Error((char *)in_RCX,in_R8);
  }
  else {
LAB_0131d1e8:
    iVar1 = TPZBaseMatrix::Rows(in_RDI);
    iVar2 = TPZBaseMatrix::Rows(in_RSI);
    if (iVar1 != iVar2) goto LAB_0131d211;
  }
  this_00 = (Fad<float> *)TPZBaseMatrix::Cols(in_RSI);
  pFVar3 = (Fad<float> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDX);
  if (this_00 == pFVar3) {
    in_stack_fffffffffffffe18 = (Fad<float> *)TPZBaseMatrix::Rows(in_RSI);
    pFVar3 = (Fad<float> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDX);
    if (in_stack_fffffffffffffe18 == pFVar3) goto LAB_0131d289;
  }
  Error((char *)in_RCX,in_R8);
LAB_0131d289:
  local_38 = TPZBaseMatrix::Rows(in_RDI);
  local_40 = TPZBaseMatrix::Cols(in_RDI);
  local_48 = TPZBaseMatrix::Cols(in_RSI);
  pFVar3 = &local_80;
  this_01 = in_RCX;
  Fad<float>::Fad(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  PrepareZ(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
           in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  Fad<float>::~Fad(in_stack_fffffffffffffde0);
  local_b8 = 0;
  Fad<float>::Fad<double,_nullptr>(in_stack_fffffffffffffdf0,(double *)in_stack_fffffffffffffde8);
  for (local_50 = (Fad<float> *)0x0; (long)local_50 < local_48;
      local_50 = (Fad<float> *)((long)&local_50->val_ + 1)) {
    if (in_stack_00000008 == 0) {
      for (local_58 = 0; local_58 < local_40; local_58 = local_58 + 1) {
        for (local_60 = (Fad<float> *)0x0; (long)local_60 < local_38;
            local_60 = (Fad<float> *)((long)&local_60->val_ + 1)) {
          in_stack_fffffffffffffdf8 =
               TPZFMatrix<Fad<float>_>::operator()
                         (in_RDX,(int64_t)in_stack_fffffffffffffdf8,
                          (int64_t)in_stack_fffffffffffffdf0);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_108,in_RDI,local_60,local_58);
          operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffffe18,pFVar3);
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_128,in_RSI,local_58,local_50);
          operator*<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>,_nullptr>
                    ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffffe18,
                     pFVar3);
          operator+<Fad<float>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_nullptr>
                    (in_stack_fffffffffffffe18,
                     (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                      *)pFVar3);
          Fad<float>::operator=
                    ((Fad<float> *)in_RDX,
                     (FadExpr<FadBinaryAdd<Fad<float>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                      *)in_stack_fffffffffffffdf8);
          FadExpr<FadBinaryAdd<Fad<float>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
          ::~FadExpr((FadExpr<FadBinaryAdd<Fad<float>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                      *)in_stack_fffffffffffffde0);
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>::
          ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                    *)in_stack_fffffffffffffde0);
          Fad<float>::~Fad(in_stack_fffffffffffffde0);
          FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffffde0);
          Fad<float>::~Fad(in_stack_fffffffffffffde0);
          (**(code **)(*(long *)this_01 + 0x118))(this_01,local_60,local_50,local_b0);
        }
      }
    }
    else {
      for (local_60 = (Fad<float> *)0x0; (long)local_60 < local_38;
          local_60 = (Fad<float> *)((long)&local_60->val_ + 1)) {
        local_130 = 0;
        Fad<float>::operator=<double,_nullptr>
                  (in_stack_fffffffffffffdf0,(double *)in_stack_fffffffffffffde8);
        for (local_58 = 0; local_58 < local_40; local_58 = local_58 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_160,in_RDI,local_58,local_60);
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (&stack0xfffffffffffffe80,in_RSI,local_58,local_50);
          operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffffe18,pFVar3);
          Fad<float>::operator+=(pFVar3,(FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_RCX);
          FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)in_stack_fffffffffffffde0);
          Fad<float>::~Fad(in_stack_fffffffffffffde0);
          Fad<float>::~Fad(in_stack_fffffffffffffde0);
        }
        in_stack_fffffffffffffde8 = local_60;
        in_stack_fffffffffffffdf0 = local_50;
        pFVar4 = this_01;
        operator*<Fad<float>,_Fad<float>,_nullptr>(in_stack_fffffffffffffe18,pFVar3);
        Fad<float>::Fad<FadBinaryMul<Fad<float>,Fad<float>>>
                  (this_00,(FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)
                           in_stack_fffffffffffffe18);
        (**(code **)(*(long *)this_01 + 0x118))
                  (this_01,in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,local_1a0);
        Fad<float>::~Fad(this_01);
        FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)this_01);
        in_stack_fffffffffffffde0 = this_01;
        this_01 = pFVar4;
      }
    }
  }
  Fad<float>::~Fad(in_stack_fffffffffffffde0);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}